

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

void ecs_map_memory(ecs_map_t *map,int32_t *allocd,int32_t *used)

{
  int iVar1;
  ecs_bucket_t *peVar2;
  ecs_bucket_t *bucket;
  int bucket_count;
  int i;
  int32_t *used_local;
  int32_t *allocd_local;
  ecs_map_t *map_local;
  
  _ecs_assert(map != (ecs_map_t *)0x0,2,(char *)0x0,"map != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/map.c"
              ,0x1ea);
  if (map != (ecs_map_t *)0x0) {
    if (used != (int32_t *)0x0) {
      *used = map->count * map->elem_size;
    }
    if (allocd != (int32_t *)0x0) {
      *allocd = *allocd + 0x18;
      iVar1 = map->bucket_count;
      for (bucket._4_4_ = 0; bucket._4_4_ < iVar1; bucket._4_4_ = bucket._4_4_ + 1) {
        peVar2 = map->buckets;
        *allocd = peVar2[bucket._4_4_].count * 8 + *allocd;
        *allocd = map->elem_size * peVar2[bucket._4_4_].count + *allocd;
      }
      *allocd = iVar1 * 0x18 + *allocd;
    }
    return;
  }
  __assert_fail("map != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/map.c"
                ,0x1ea,"void ecs_map_memory(ecs_map_t *, int32_t *, int32_t *)");
}

Assistant:

void ecs_map_memory(
    ecs_map_t *map, 
    int32_t *allocd,
    int32_t *used)
{
    ecs_assert(map != NULL, ECS_INVALID_PARAMETER, NULL);

    if (used) {
        *used = map->count * map->elem_size;
    }

    if (allocd) {
        *allocd += ECS_SIZEOF(ecs_map_t);

        int i, bucket_count = map->bucket_count;
        for (i = 0; i < bucket_count; i ++) {
            ecs_bucket_t *bucket = &map->buckets[i];
            *allocd += KEY_SIZE * bucket->count;
            *allocd += map->elem_size * bucket->count;
        }

        *allocd += ECS_SIZEOF(ecs_bucket_t) * bucket_count;
    }
}